

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O2

aom_codec_err_t av1_copy_reference_dec(AV1Decoder *pbi,int idx,YV12_BUFFER_CONFIG *sd)

{
  uint8_t uVar1;
  RefCntBuffer *pRVar2;
  int iVar3;
  aom_codec_err_t aVar4;
  YV12_BUFFER_CONFIG *a;
  
  uVar1 = ((pbi->common).seq_params)->monochrome;
  if (((uint)idx < 8) &&
     (pRVar2 = (pbi->common).ref_frame_map[(uint)idx], pRVar2 != (RefCntBuffer *)0x0)) {
    a = &pRVar2->buf;
    iVar3 = equal_dimensions(a,sd);
    if (iVar3 == 0) {
      aom_internal_error(&pbi->error,AOM_CODEC_ERROR,"Incorrect buffer dimensions");
    }
    else {
      aom_yv12_copy_frame_c(a,sd,(uint)(uVar1 == '\0') * 2 + 1);
    }
    aVar4 = (pbi->error).error_code;
  }
  else {
    aVar4 = AOM_CODEC_ERROR;
    aom_internal_error(&pbi->error,AOM_CODEC_ERROR,"No reference frame");
  }
  return aVar4;
}

Assistant:

aom_codec_err_t av1_copy_reference_dec(AV1Decoder *pbi, int idx,
                                       YV12_BUFFER_CONFIG *sd) {
  AV1_COMMON *cm = &pbi->common;
  const int num_planes = av1_num_planes(cm);

  const YV12_BUFFER_CONFIG *const cfg = get_ref_frame(cm, idx);
  if (cfg == NULL) {
    aom_internal_error(&pbi->error, AOM_CODEC_ERROR, "No reference frame");
    return AOM_CODEC_ERROR;
  }
  if (!equal_dimensions(cfg, sd))
    aom_internal_error(&pbi->error, AOM_CODEC_ERROR,
                       "Incorrect buffer dimensions");
  else
    aom_yv12_copy_frame(cfg, sd, num_planes);

  return pbi->error.error_code;
}